

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,string *dir)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  undefined4 local_1ec;
  string local_1e8 [48];
  undefined1 local_1b8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_40 [8];
  string sourceDirectory;
  string *dir_local;
  cmCTestUpdateHandler *this_local;
  
  sourceDirectory.field_2._8_8_ = dir;
  std::__cxx11::string::string((string *)local_40,(string *)dir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  poVar2 = std::operator<<((ostream *)local_1b8,"Check directory: ");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x10a,msg,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::__cxx11::string::operator+=((string *)local_40,"/.svn");
  bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
  if (bVar1) {
    this_local._4_4_ = 2;
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[5]>
              (&local_210,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               sourceDirectory.field_2._8_8_,(char (*) [5])"/CVS");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[6]>
                (&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 sourceDirectory.field_2._8_8_,(char (*) [6])"/.bzr");
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
      if (bVar1) {
        this_local._4_4_ = 3;
      }
      else {
        cmStrCat<std::__cxx11::string_const&,char_const(&)[6]>
                  (&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   sourceDirectory.field_2._8_8_,(char (*) [6])"/.git");
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
        if (bVar1) {
          this_local._4_4_ = 4;
        }
        else {
          cmStrCat<std::__cxx11::string_const&,char_const(&)[5]>
                    (&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     sourceDirectory.field_2._8_8_,(char (*) [5])"/.hg");
          std::__cxx11::string::operator=((string *)local_40,(string *)&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
          if (bVar1) {
            this_local._4_4_ = 5;
          }
          else {
            cmStrCat<std::__cxx11::string_const&,char_const(&)[5]>
                      (&local_290,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       sourceDirectory.field_2._8_8_,(char (*) [5])"/.p4");
            std::__cxx11::string::operator=((string *)local_40,(string *)&local_290);
            std::__cxx11::string::~string((string *)&local_290);
            bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
            if (bVar1) {
              this_local._4_4_ = 6;
            }
            else {
              cmStrCat<std::__cxx11::string_const&,char_const(&)[11]>
                        (&local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         sourceDirectory.field_2._8_8_,(char (*) [11])"/.p4config");
              std::__cxx11::string::operator=((string *)local_40,(string *)&local_2b0);
              std::__cxx11::string::~string((string *)&local_2b0);
              bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
              if (bVar1) {
                this_local._4_4_ = 6;
              }
              else {
                this_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  local_1ec = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const std::string& dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Check directory: " << sourceDirectory << std::endl,
                     this->Quiet);
  sourceDirectory += "/.svn";
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_SVN;
  }
  sourceDirectory = cmStrCat(dir, "/CVS");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_CVS;
  }
  sourceDirectory = cmStrCat(dir, "/.bzr");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_BZR;
  }
  sourceDirectory = cmStrCat(dir, "/.git");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_GIT;
  }
  sourceDirectory = cmStrCat(dir, "/.hg");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_HG;
  }
  sourceDirectory = cmStrCat(dir, "/.p4");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  sourceDirectory = cmStrCat(dir, "/.p4config");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}